

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O3

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  byte bVar1;
  int stride;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ALPHDecoder *pAVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  size_t __n;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  
  iVar6 = io->crop_bottom;
  if (iVar6 < num_rows + row || (num_rows < 1 || row < 0)) {
    return (uint8_t *)0x0;
  }
  stride = io->width;
  if (dec->is_alpha_decoded_ == 0) {
    pAVar7 = dec->alph_dec_;
    if (pAVar7 == (ALPHDecoder *)0x0) {
      pAVar7 = (ALPHDecoder *)WebPSafeCalloc(1,0xd8);
      dec->alph_dec_ = pAVar7;
      if (pAVar7 == (ALPHDecoder *)0x0) {
        return (uint8_t *)0x0;
      }
      puVar13 = (uint8_t *)WebPSafeMalloc((long)io->crop_bottom * (long)io->width,1);
      dec->alpha_plane_mem_ = puVar13;
      if (puVar13 == (uint8_t *)0x0) goto LAB_0011d13b;
      dec->alpha_plane_ = puVar13;
      dec->alpha_prev_line_ = (uint8_t *)0x0;
      pAVar7 = dec->alph_dec_;
      pbVar2 = dec->alpha_data_;
      uVar8 = dec->alpha_data_size_;
      VP8FiltersInit();
      pAVar7->output_ = puVar13;
      iVar4 = io->height;
      pAVar7->width_ = io->width;
      pAVar7->height_ = iVar4;
      if (uVar8 < 2) goto LAB_0011d13b;
      bVar1 = *pbVar2;
      pAVar7->method_ = bVar1 & 3;
      pAVar7->filter_ = *pbVar2 >> 2 & WEBP_FILTER_GRADIENT;
      uVar5 = *pbVar2 >> 4 & 3;
      pAVar7->pre_processing_ = uVar5;
      if (((1 < (byte)(bVar1 & 3)) || (1 < (byte)uVar5)) || (0x3f < *pbVar2)) goto LAB_0011d13b;
      uVar8 = uVar8 - 1;
      VP8InitIoInternal(&pAVar7->io_,0x209);
      WebPInitCustomIo((WebPDecParams *)0x0,&pAVar7->io_);
      (pAVar7->io_).opaque = pAVar7;
      iVar4 = io->height;
      (pAVar7->io_).width = io->width;
      (pAVar7->io_).height = iVar4;
      iVar4 = io->crop_left;
      iVar10 = io->crop_right;
      iVar3 = io->crop_top;
      (pAVar7->io_).use_cropping = io->use_cropping;
      (pAVar7->io_).crop_left = iVar4;
      (pAVar7->io_).crop_right = iVar10;
      (pAVar7->io_).crop_top = iVar3;
      (pAVar7->io_).crop_bottom = io->crop_bottom;
      if (pAVar7->method_ == 0) {
        uVar5 = (uint)((ulong)((long)pAVar7->height_ * (long)pAVar7->width_) <= uVar8);
      }
      else {
        uVar5 = VP8LDecodeAlphaHeader(pAVar7,pbVar2 + 1,uVar8);
      }
      if (uVar5 == 0) goto LAB_0011d13b;
      pAVar7 = dec->alph_dec_;
      if (pAVar7->pre_processing_ == 1) {
        num_rows = iVar6 - row;
      }
      else {
        dec->alpha_dithering_ = 0;
      }
    }
    iVar6 = (pAVar7->io_).crop_bottom;
    if (pAVar7->method_ == 0) {
      iVar4 = pAVar7->width_;
      __n = (size_t)iVar4;
      puVar13 = dec->alpha_prev_line_;
      puVar14 = dec->alpha_data_;
      puVar11 = dec->alpha_plane_;
      lVar9 = (long)(iVar4 * row);
      if (pAVar7->filter_ == WEBP_FILTER_NONE) {
        iVar4 = num_rows;
        if (0 < num_rows) {
          do {
            memcpy(puVar11 + lVar9,puVar14 + lVar9 + 1,__n);
            lVar9 = lVar9 + __n;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          puVar13 = puVar11 + (lVar9 - __n);
        }
      }
      else if (0 < num_rows) {
        puVar14 = puVar14 + lVar9 + 1;
        puVar11 = puVar11 + lVar9;
        iVar10 = num_rows;
        do {
          (*WebPUnfilters[pAVar7->filter_])(puVar13,puVar14,puVar11,iVar4);
          puVar12 = puVar11 + __n;
          puVar14 = puVar14 + __n;
          iVar10 = iVar10 + -1;
          puVar13 = puVar11;
          puVar11 = puVar12;
        } while (iVar10 != 0);
        puVar13 = puVar12 + -__n;
      }
      dec->alpha_prev_line_ = puVar13;
    }
    else {
      iVar4 = VP8LDecodeAlphaImageStream(pAVar7,num_rows + row);
      if (iVar4 == 0) goto LAB_0011d13b;
    }
    if (num_rows + row < iVar6) {
      if (dec->is_alpha_decoded_ == 0) goto LAB_0011ce04;
    }
    else {
      dec->is_alpha_decoded_ = 1;
    }
    ALPHDelete(dec->alph_dec_);
    dec->alph_dec_ = (ALPHDecoder *)0x0;
    if ((0 < dec->alpha_dithering_) &&
       (iVar6 = WebPDequantizeLevels
                          (dec->alpha_plane_ + (long)io->crop_left + (long)(io->crop_top * stride),
                           io->crop_right - io->crop_left,io->crop_bottom - io->crop_top,stride,
                           dec->alpha_dithering_), iVar6 == 0)) {
LAB_0011d13b:
      WebPSafeFree(dec->alpha_plane_mem_);
      dec->alpha_plane_mem_ = (uint8_t *)0x0;
      dec->alpha_plane_ = (uint8_t *)0x0;
      ALPHDelete(dec->alph_dec_);
      dec->alph_dec_ = (ALPHDecoder *)0x0;
      return (uint8_t *)0x0;
    }
  }
LAB_0011ce04:
  return dec->alpha_plane_ + stride * row;
}

Assistant:

const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                      const VP8Io* const io,
                                      int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded_) {
    if (dec->alph_dec_ == NULL) {    // Initialize decoder.
      dec->alph_dec_ = ALPHNew();
      if (dec->alph_dec_ == NULL) return NULL;
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec_, dec->alpha_data_, dec->alpha_data_size_,
                    io, dec->alpha_plane_)) {
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec_->pre_processing_ != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering_ = 0;   // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec_ != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded_) {   // finished?
      ALPHDelete(dec->alph_dec_);
      dec->alph_dec_ = NULL;
      if (dec->alpha_dithering_ > 0) {
        uint8_t* const alpha = dec->alpha_plane_ + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering_)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane_ + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}